

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O0

void __thiscall
btPoint2PointConstraint::btPoint2PointConstraint
          (btPoint2PointConstraint *this,btRigidBody *rbA,btVector3 *pivotInA)

{
  undefined8 uVar1;
  btScalar *pbVar2;
  undefined8 *in_RDX;
  btRigidBody *in_RSI;
  btTransform *in_RDI;
  btVector3 bVar3;
  btRigidBody *local_78;
  undefined1 in_stack_ffffffffffffff98 [16];
  btTransform *pbVar4;
  btScalar *local_30;
  
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._4_4_,local_78);
  *(undefined ***)(in_RDI->m_basis).m_el[0].m_floats = &PTR__btPoint2PointConstraint_002e73d0;
  pbVar4 = in_RDI + 5;
  pbVar2 = in_RDI[1].m_basis.m_el[0].m_floats + 2;
  do {
    local_30 = pbVar2;
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)local_78);
    pbVar2 = local_30 + 0x15;
  } while (local_30 + 0x15 != (pbVar4->m_basis).m_el[0].m_floats + 1);
  uVar1 = in_RDX[1];
  *(undefined8 *)(in_RDI[5].m_basis.m_el[0].m_floats + 1) = *in_RDX;
  *(undefined8 *)(in_RDI[5].m_basis.m_el[0].m_floats + 3) = uVar1;
  pbVar4 = in_RDI;
  btRigidBody::getCenterOfMassTransform(in_RSI);
  bVar3 = btTransform::operator()(pbVar4,(btVector3 *)local_30);
  *(long *)(in_RDI[5].m_basis.m_el[1].m_floats + 1) = bVar3.m_floats._0_8_;
  *(long *)(in_RDI[5].m_basis.m_el[1].m_floats + 3) = bVar3.m_floats._8_8_;
  pbVar4[5].m_basis.m_el[2].m_floats[1] = 0.0;
  *(undefined1 *)pbVar4[5].m_origin.m_floats = 0;
  btConstraintSetting::btConstraintSetting((btConstraintSetting *)(pbVar4[5].m_origin.m_floats + 1))
  ;
  return;
}

Assistant:

btPoint2PointConstraint::btPoint2PointConstraint(btRigidBody& rbA,const btVector3& pivotInA)
:btTypedConstraint(POINT2POINT_CONSTRAINT_TYPE,rbA),m_pivotInA(pivotInA),m_pivotInB(rbA.getCenterOfMassTransform()(pivotInA)),
m_flags(0),
m_useSolveConstraintObsolete(false)
{
	
}